

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509cset.cc
# Opt level: O0

int X509_CRL_set1_nextUpdate(X509_CRL *x,ASN1_TIME *tm)

{
  ASN1_STRING *local_28;
  ASN1_TIME *in;
  ASN1_TIME *tm_local;
  X509_CRL *x_local;
  
  if (x == (X509_CRL *)0x0) {
    x_local._4_4_ = 0;
  }
  else {
    local_28 = (ASN1_STRING *)x->crl->nextUpdate;
    if ((local_28 != (ASN1_STRING *)tm) &&
       (local_28 = ASN1_STRING_dup((ASN1_STRING *)tm), local_28 != (ASN1_STRING *)0x0)) {
      ASN1_TIME_free((ASN1_TIME *)x->crl->nextUpdate);
      x->crl->nextUpdate = (ASN1_TIME *)local_28;
    }
    x_local._4_4_ = (uint)(local_28 != (ASN1_STRING *)0x0);
  }
  return x_local._4_4_;
}

Assistant:

int X509_CRL_set1_nextUpdate(X509_CRL *x, const ASN1_TIME *tm) {
  ASN1_TIME *in;

  if (x == NULL) {
    return 0;
  }
  in = x->crl->nextUpdate;
  if (in != tm) {
    in = ASN1_STRING_dup(tm);
    if (in != NULL) {
      ASN1_TIME_free(x->crl->nextUpdate);
      x->crl->nextUpdate = in;
    }
  }
  return in != NULL;
}